

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<long,(unsigned_char)2>,wabt::interp::Simd<int,(unsigned_char)4>,false>
          (Thread *this)

{
  u8 laneidx;
  long lVar1;
  Simd<long,_(unsigned_char)__x02_> result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  Simd<int,_(unsigned_char)__x04_> rhs;
  long alStack_48 [2];
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  alStack_48[1] = 0x1cd595;
  local_18.v128_.v = (v128)Pop(this);
  alStack_48[1] = 0x1cd5a7;
  local_28.v128_.v = (v128)Pop(this);
  lVar1 = 2;
  do {
    alStack_48[lVar1] =
         (long)*(int *)((long)&local_18 + lVar1 * 4) * (long)*(int *)((long)&local_28 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 3);
  alStack_48[1] = 0x1cd5e3;
  Push(this,(Value)local_38.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}